

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

QAM * __thiscall OSTEI_Writer::FunctionPrototype__abi_cxx11_(OSTEI_Writer *this,QAM *am)

{
  long lVar1;
  ostream *poVar2;
  QAM *in_RDI;
  stringstream ss;
  string indent;
  string fname;
  QAM *in_stack_fffffffffffffd08;
  QAM *in_stack_fffffffffffffd10;
  QAM *this_00;
  allocator local_269;
  string local_268 [32];
  string local_248 [32];
  stringstream local_228 [16];
  ostream local_218 [8];
  string *in_stack_fffffffffffffdf0;
  QAM *in_stack_fffffffffffffdf8;
  allocator local_99;
  string local_98 [96];
  string local_38 [56];
  
  this_00 = in_RDI;
  QAM::QAM(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  FunctionName__abi_cxx11_((OSTEI_Writer *)this_00,in_RDI);
  QAM::~QAM((QAM *)0x1557b4);
  lVar1 = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,lVar1 + 5,' ',&local_99);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::__cxx11::stringstream::stringstream(local_228);
  poVar2 = std::operator<<(local_218,"int ");
  poVar2 = std::operator<<(poVar2,local_38);
  std::operator<<(poVar2,"(");
  std::operator<<(local_218,"struct simint_multi_shellpair const P,\n");
  poVar2 = std::operator<<(local_218,local_98);
  std::operator<<(poVar2,"struct simint_multi_shellpair const Q,\n");
  poVar2 = std::operator<<(local_218,local_98);
  std::operator<<(poVar2,"double screen_tol,\n");
  poVar2 = std::operator<<(local_218,local_98);
  std::operator<<(poVar2,"double * const restrict work,\n");
  poVar2 = std::operator<<(local_218,local_98);
  poVar2 = std::operator<<(poVar2,"double * const restrict ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"",&local_269);
  ArrVarName(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  poVar2 = std::operator<<(poVar2,local_248);
  std::operator<<(poVar2,")");
  std::__cxx11::string::~string(local_248);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_228);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_38);
  return this_00;
}

Assistant:

std::string OSTEI_Writer::FunctionPrototype_(QAM am) const
{
    std::string fname = FunctionName_(am);
    std::string indent(fname.length()+1+4, ' '); // +4 for return type

    std::stringstream ss;
    ss << "int " << fname << "(";
    ss << "struct simint_multi_shellpair const P,\n";
    ss << indent << "struct simint_multi_shellpair const Q,\n";
    ss << indent << "double screen_tol,\n";
    ss << indent << "double * const restrict work,\n";
    ss << indent << "double * const restrict " << ArrVarName(am) << ")";
    return ss.str();
}